

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcSetExecutorStackSize(uint bytes)

{
  bool bVar1;
  
  if (NULLC::initialized != '\0') {
    bVar1 = ExecutorX86::SetStackSize(NULLC::executorX86,bytes);
    if (bVar1) {
      bVar1 = ExecutorRegVm::SetStackSize(NULLC::executorRegVm,bytes);
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  return '\0';
}

Assistant:

nullres nullcSetExecutorStackSize(unsigned bytes)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

#ifndef NULLC_NO_EXECUTOR

#ifdef NULLC_BUILD_X86_JIT
	if(!executorX86->SetStackSize(bytes))
		return 0;
#endif

#if defined(NULLC_LLVM_SUPPORT)
	if(!executorLLVM->SetStackSize(bytes))
		return 0;
#endif
	if(!executorRegVm->SetStackSize(bytes))
		return 0;
#endif

	(void)bytes;
	return 1;
}